

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_CDict *pZVar1;
  size_t sVar2;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_50;
  
  sVar2 = 0xffffffffffffffc4;
  if ((cctx->streamStage == zcss_init) && (sVar2 = 0xffffffffffffffc0, cctx->staticSize == 0)) {
    ZSTD_freeCDict(cctx->cdictLocal);
    if (dict == (void *)0x0 || dictSize == 0) {
      cctx->cdictLocal = (ZSTD_CDict *)0x0;
      cctx->cdict = (ZSTD_CDict *)0x0;
    }
    else {
      ZSTD_getCParamsFromCCtxParams
                (&local_50,&cctx->requestedParams,cctx->pledgedSrcSizePlusOne - 1,dictSize);
      cParams_00.hashLog = local_50.hashLog;
      cParams_00.windowLog = local_50.windowLog;
      cParams_00.chainLog = local_50.chainLog;
      cParams_00.searchLog = local_50.searchLog;
      cParams_00.minMatch = local_50.minMatch;
      cParams_00.targetLength = local_50.targetLength;
      cParams_00.strategy = local_50.strategy;
      pZVar1 = ZSTD_createCDict_advanced
                         (dict,dictSize,dictLoadMethod,dictContentType,cParams_00,cctx->customMem);
      cctx->cdictLocal = pZVar1;
      cctx->cdict = pZVar1;
      if (pZVar1 == (ZSTD_CDict *)0x0) {
        return 0xffffffffffffffc0;
      }
    }
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    if (cctx->streamStage != zcss_init) return ERROR(stage_wrong);
    if (cctx->staticSize) return ERROR(memory_allocation);  /* no malloc for static CCtx */
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_freeCDict(cctx->cdictLocal);  /* in case one already exists */
    if (dict==NULL || dictSize==0) {   /* no dictionary mode */
        cctx->cdictLocal = NULL;
        cctx->cdict = NULL;
    } else {
        ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(&cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, dictSize);
        cctx->cdictLocal = ZSTD_createCDict_advanced(
                                dict, dictSize,
                                dictLoadMethod, dictContentType,
                                cParams, cctx->customMem);
        cctx->cdict = cctx->cdictLocal;
        if (cctx->cdictLocal == NULL)
            return ERROR(memory_allocation);
    }
    return 0;
}